

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar4;
  char *pcVar5;
  pointer pTVar6;
  Colour colourGuard;
  string description;
  undefined1 local_78 [40];
  size_t local_50;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  pcVar5 = "All available test cases:\n";
  if ((char)iVar3 != '\0') {
    pcVar5 = "Matching test cases:\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar5);
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests(&matchedTestCases,testCases,(TestSpec *)CONCAT44(extraout_var,iVar2),
              &config->super_IConfig);
  pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar6 = matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
    colourGuard.m_moved = false;
    Colour::use((int)((pTVar6->super_TestCaseInfo).properties << 0x1e) >> 0x1f & FileName);
    clara::TextFlow::Column::Column((Column *)local_78,(string *)pTVar6);
    local_50 = 2;
    local_78._32_8_ = 4;
    poVar4 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
    std::operator<<(poVar4,"\n");
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
    iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])(config);
    if (1 < iVar2) {
      StringMaker<Catch::SourceLineInfo,_void>::convert<Catch::SourceLineInfo>
                (&description,&(pTVar6->super_TestCaseInfo).lineInfo);
      clara::TextFlow::Column::Column((Column *)local_78,&description);
      local_78._32_8_ = 4;
      poVar4 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
      std::endl<char,std::char_traits<char>>(poVar4);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::string((string *)&description,&(pTVar6->super_TestCaseInfo).description)
      ;
      if (description._M_string_length == 0) {
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        assign(&description,"(NO DESCRIPTION)");
      }
      clara::TextFlow::Column::Column((Column *)local_78,&description);
      local_78._32_8_ = 4;
      poVar4 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
      std::endl<char,std::char_traits<char>>(poVar4);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::__cxx11::string::~string((string *)&description);
    }
    if ((pTVar6->super_TestCaseInfo).tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pTVar6->super_TestCaseInfo).tags.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      TestCaseInfo::tagsAsString_abi_cxx11_(&description,&pTVar6->super_TestCaseInfo);
      clara::TextFlow::Column::Column((Column *)local_78,&description);
      local_78._32_8_ = 6;
      poVar4 = clara::TextFlow::operator<<((ostream *)&std::cout,(Column *)local_78);
      std::operator<<(poVar4,"\n");
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::__cxx11::string::~string((string *)&description);
    }
    Colour::~Colour(&colourGuard);
  }
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  pTVar6 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"test case",(allocator<char> *)&colourGuard);
    local_78._0_8_ = ((long)pTVar6 - (long)pTVar1) / 0xb8;
    std::__cxx11::string::string((string *)(local_78 + 8),&description);
    operator<<((ostream *)&std::cout,(pluralise *)local_78);
    poVar4 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"matching test case",(allocator<char> *)&colourGuard);
    local_78._0_8_ = ((long)pTVar6 - (long)pTVar1) / 0xb8;
    std::__cxx11::string::string((string *)(local_78 + 8),&description);
    operator<<((ostream *)&std::cout,(pluralise *)local_78);
    poVar4 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&description);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  return ((long)matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)matchedTestCases.
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
               super__Vector_impl_data._M_start) / 0xb8;
}

Assistant:

std::size_t listTests(Config const &config) {
    TestSpec const &testSpec = config.testSpec();
    if (config.hasTestFilters())
      Catch::cout() << "Matching test cases:\n";
    else {
      Catch::cout() << "All available test cases:\n";
    }

    auto matchedTestCases = filterTests(getAllTestCasesSorted(config), testSpec, config);
    for (auto const &testCaseInfo : matchedTestCases) {
      Colour::Code colour = testCaseInfo.isHidden() ? Colour::SecondaryText : Colour::None;
      Colour colourGuard(colour);

      Catch::cout() << Column(testCaseInfo.name).initialIndent(2).indent(4) << "\n";
      if (config.verbosity() >= Verbosity::High) {
        Catch::cout() << Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << std::endl;
        std::string description = testCaseInfo.description;
        if (description.empty())
          description = "(NO DESCRIPTION)";
        Catch::cout() << Column(description).indent(4) << std::endl;
      }
      if (!testCaseInfo.tags.empty())
        Catch::cout() << Column(testCaseInfo.tagsAsString()).indent(6) << "\n";
    }

    if (!config.hasTestFilters())
      Catch::cout() << pluralise(matchedTestCases.size(), "test case") << '\n'
                    << std::endl;
    else
      Catch::cout() << pluralise(matchedTestCases.size(), "matching test case") << '\n'
                    << std::endl;
    return matchedTestCases.size();
  }